

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

bool __thiscall ON_PolyCurve::SetStartPoint(ON_PolyCurve *this,ON_3dPoint start_point)

{
  undefined1 uVar1;
  ON_Curve *pOVar3;
  int iVar2;
  
  if ((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count < 1) {
    pOVar3 = (ON_Curve *)0x0;
  }
  else {
    pOVar3 = *(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
  }
  if (pOVar3 == (ON_Curve *)0x0) {
    uVar1 = 0;
  }
  else {
    iVar2 = (*(pOVar3->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x39])();
    uVar1 = (undefined1)iVar2;
  }
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  return (bool)uVar1;
}

Assistant:

bool ON_PolyCurve::SetStartPoint(ON_3dPoint start_point)
{
  bool rc = false;
  // just do it // if ( !IsClosed() )
  {
    ON_Curve* c = FirstSegmentCurve();
    if ( c )
      rc = c->SetStartPoint(start_point);
  }
	DestroyCurveTree();
  return rc;
}